

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_is_coinbase(wally_tx *tx,size_t *written)

{
  wally_tx_input *pwVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = -2;
  if (written != (size_t *)0x0 && tx != (wally_tx *)0x0) {
    iVar2 = 0;
    if ((((tx->num_inputs == 1) && (pwVar1 = tx->inputs, pwVar1 != (wally_tx_input *)0x0)) &&
        (pwVar1->index == 0xffffffff)) && (pwVar1->txhash[0] == '\0')) {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (uVar4 == 0x1f) break;
        uVar3 = uVar4 + 1;
      } while (pwVar1->txhash[uVar4 + 1] == '\0');
      uVar3 = (ulong)(0x1e < uVar4);
    }
    else {
      uVar3 = 0;
    }
    *written = uVar3;
  }
  return iVar2;
}

Assistant:

int wally_tx_is_coinbase(const struct wally_tx *tx, size_t *written)
{
    if (!tx || !written)
        return WALLY_EINVAL;

    *written = tx->num_inputs == 1 && is_valid_coinbase_input(tx->inputs);

    return WALLY_OK;
}